

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar_check.cpp
# Opt level: O0

void __thiscall
CalendarFixture_julian_plus_one_date_check_Test::TestBody
          (CalendarFixture_julian_plus_one_date_check_Test *this)

{
  bool bVar1;
  int iVar2;
  char *message;
  AssertHelper local_70;
  Message local_68 [3];
  int local_4c;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  undefined1 local_30 [4];
  int julian_absolute;
  JulianCalendar julian_calendar;
  int absolute;
  CalendarFixture_julian_plus_one_date_check_Test *this_local;
  
  julian_calendar.super_Calendar._20_4_ =
       GregorianCalendar::operator_cast_to_int((this->super_CalendarFixture).gregorian_calendar);
  JulianCalendar::JulianCalendar((JulianCalendar *)local_30,julian_calendar.super_Calendar._20_4_);
  iVar2 = JulianCalendar::operator_cast_to_int((JulianCalendar *)local_30);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = iVar2 + 2;
  local_4c = 0xb39d7;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_48,"julian_absolute","735702 + 1",
             (int *)((long)&gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 4),&local_4c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(local_68);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/anastasiak2512[P]Calendar/calendars_tests/basic_tests/calendar_check.cpp"
               ,0x3e,message);
    testing::internal::AssertHelper::operator=(&local_70,local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  return;
}

Assistant:

TEST_F(CalendarFixture, julian_plus_one_date_check) {
    int absolute = *gregorian_calendar;
    JulianCalendar julian_calendar(absolute);

    int julian_absolute = julian_calendar + 2;
    EXPECT_EQ(julian_absolute, TEST_ABSOLUTE + 1);
}